

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

realtype N_VWrmsNormMask_SensWrapper(N_Vector x,N_Vector w,N_Vector id)

{
  int i;
  long lVar1;
  realtype rVar2;
  realtype rVar3;
  
  rVar2 = 0.0;
  for (lVar1 = 0; lVar1 < (int)*(long *)((long)x->content + 8); lVar1 = lVar1 + 1) {
    rVar3 = N_VWrmsNormMask(*(N_Vector *)(*x->content + lVar1 * 8),
                            *(N_Vector *)(*w->content + lVar1 * 8),
                            *(N_Vector *)(*id->content + lVar1 * 8));
    if (rVar3 <= rVar2) {
      rVar3 = rVar2;
    }
    rVar2 = rVar3;
  }
  return rVar2;
}

Assistant:

realtype N_VWrmsNormMask_SensWrapper(N_Vector x, N_Vector w, N_Vector id)
{
  int i;
  realtype nrm, tmp;

  nrm = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VWrmsNormMask(NV_VEC_SW(x,i), NV_VEC_SW(w,i), NV_VEC_SW(id,i));
    if (tmp > nrm) nrm = tmp;
  }

  return(nrm);
}